

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O1

void __thiscall Rml::Context::SetDimensions(Context *this,Vector2i _dimensions)

{
  Vector2f content;
  int iVar1;
  Element *pEVar2;
  ElementDocument *this_00;
  int index;
  undefined1 local_58 [16];
  pointer local_48;
  
  if (((this->dimensions).x != _dimensions.x) || ((this->dimensions).y != _dimensions.y)) {
    this->dimensions = _dimensions;
    RenderManager::SetViewport(this->render_manager,_dimensions);
    pEVar2 = (this->root)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
             _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
             super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
    content.y = (float)(this->dimensions).y;
    content.x = (float)(this->dimensions).x;
    Box::Box((Box *)local_58,content);
    Element::SetBox(pEVar2,(Box *)local_58);
    Box::~Box((Box *)local_58);
    (**(code **)((long)(((this->root)._M_t.
                         super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                         super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                         super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl)->
                       super_ScriptInterface).super_Releasable + 0xa8))();
    index = 0;
    iVar1 = Element::GetNumChildren
                      ((this->root)._M_t.
                       super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                       super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                       super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,false);
    if (0 < iVar1) {
      do {
        pEVar2 = Element::GetChild((this->root)._M_t.
                                   super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>
                                   .super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,index)
        ;
        this_00 = Element::GetOwnerDocument(pEVar2);
        if (this_00 != (ElementDocument *)0x0) {
          ElementDocument::DirtyMediaQueries(this_00);
          ElementDocument::DirtyVwAndVhProperties(this_00);
          (*(this_00->super_Element).super_ScriptInterface.super_Releasable._vptr_Releasable[0x15])
                    (this_00);
          ElementDocument::DirtyPosition(this_00);
          local_58._0_4_ = 0.0;
          local_58._4_4_ = 0.0;
          local_58._8_8_ = (pointer)0x0;
          local_48 = (pointer)0x0;
          Element::DispatchEvent(&this_00->super_Element,Resize,(Dictionary *)local_58);
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                     *)local_58);
        }
        index = index + 1;
        iVar1 = Element::GetNumChildren
                          ((this->root)._M_t.
                           super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                           super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                           super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,false);
      } while (index < iVar1);
    }
  }
  return;
}

Assistant:

void Context::SetDimensions(const Vector2i _dimensions)
{
	if (dimensions != _dimensions)
	{
		dimensions = _dimensions;
		render_manager->SetViewport(dimensions);
		root->SetBox(Box(Vector2f(dimensions)));
		root->DirtyLayout();

		for (int i = 0; i < root->GetNumChildren(); ++i)
		{
			ElementDocument* document = root->GetChild(i)->GetOwnerDocument();
			if (document != nullptr)
			{
				document->DirtyMediaQueries();
				document->DirtyVwAndVhProperties();
				document->DirtyLayout();
				document->DirtyPosition();
				document->DispatchEvent(EventId::Resize, Dictionary());
			}
		}
	}
}